

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

void __thiscall ConditionalExecution::predefineDirectMulti(ConditionalExecution *this,PcodeOp *op)

{
  Funcdata *pFVar1;
  int iVar2;
  PcodeOp *op_00;
  int4 iVar3;
  Address *m;
  Varnode *pVVar4;
  mapped_type *ppVVar5;
  int4 local_54;
  int local_50;
  int4 local_4c;
  int4 i;
  int4 inslot;
  Varnode *vn;
  Varnode *newoutvn;
  Varnode *outvn;
  PcodeOp *local_20;
  PcodeOp *newop;
  PcodeOp *op_local;
  ConditionalExecution *this_local;
  
  pFVar1 = this->fd;
  newop = op;
  op_local = (PcodeOp *)this;
  iVar3 = FlowBlock::sizeIn(&this->posta_block->super_FlowBlock);
  (*(this->posta_block->super_FlowBlock)._vptr_FlowBlock[2])(&outvn);
  local_20 = Funcdata::newOp(pFVar1,iVar3 + 1,(Address *)&outvn);
  newoutvn = PcodeOp::getOut(newop);
  pFVar1 = this->fd;
  iVar3 = Varnode::getSize(newoutvn);
  m = Varnode::getAddr(newoutvn);
  vn = Funcdata::newVarnodeOut(pFVar1,iVar3,m,local_20);
  Funcdata::opSetOpcode(this->fd,local_20,CPUI_MULTIEQUAL);
  local_4c = FlowBlock::getOutRevIndex(&this->iblock->super_FlowBlock,this->posta_outslot);
  local_50 = 0;
  while( true ) {
    iVar2 = local_50;
    iVar3 = FlowBlock::sizeIn(&this->posta_block->super_FlowBlock);
    op_00 = local_20;
    if (iVar3 <= iVar2) break;
    if (local_50 == local_4c) {
      _i = PcodeOp::getIn(newop,1 - this->camethruposta_slot);
    }
    else {
      _i = vn;
    }
    Funcdata::opSetInput(this->fd,local_20,_i,local_50);
    local_50 = local_50 + 1;
  }
  pFVar1 = this->fd;
  pVVar4 = PcodeOp::getIn(newop,this->camethruposta_slot);
  iVar3 = FlowBlock::sizeIn(&this->posta_block->super_FlowBlock);
  Funcdata::opSetInput(pFVar1,op_00,pVVar4,iVar3);
  Funcdata::opInsertBegin(this->fd,local_20,this->posta_block);
  pVVar4 = vn;
  local_54 = FlowBlock::getIndex(&this->posta_block->super_FlowBlock);
  ppVVar5 = std::
            map<int,_Varnode_*,_std::less<int>,_std::allocator<std::pair<const_int,_Varnode_*>_>_>::
            operator[](&this->replacement,&local_54);
  *ppVVar5 = pVVar4;
  return;
}

Assistant:

void ConditionalExecution::predefineDirectMulti(PcodeOp *op)

{
  PcodeOp *newop = fd->newOp(posta_block->sizeIn()+1,posta_block->getStart());
  Varnode *outvn = op->getOut();
  Varnode *newoutvn;
  newoutvn = fd->newVarnodeOut(outvn->getSize(),outvn->getAddr(),newop);
  fd->opSetOpcode(newop,CPUI_MULTIEQUAL);
  Varnode *vn;
  int4 inslot = iblock->getOutRevIndex(posta_outslot);
  for(int4 i=0;i<posta_block->sizeIn();++i) {
    if (i==inslot)
      vn = op->getIn(1-camethruposta_slot);
    else
      vn = newoutvn;
    fd->opSetInput(newop,vn,i);
  }
  fd->opSetInput(newop,op->getIn(camethruposta_slot),posta_block->sizeIn());
  fd->opInsertBegin(newop,posta_block);

  // Cache this new data flow holder
  replacement[posta_block->getIndex()] = newoutvn;
}